

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void print_all_live_ranges(gen_ctx_t gen_ctx)

{
  MIR_context_t ctx;
  FILE *pFVar1;
  int iVar2;
  MIR_type_t tp;
  size_t sVar3;
  live_range_t_conflict lr;
  char *pcVar4;
  char *pcVar5;
  MIR_reg_t reg;
  size_t i;
  ulong ix;
  
  ctx = gen_ctx->ctx;
  fwrite("+++++++++++++Live ranges:\n",0x1a,1,(FILE *)gen_ctx->debug_file);
  ix = 0;
  while( true ) {
    sVar3 = VARR_live_range_tlength(gen_ctx->lr_ctx->var_live_ranges);
    if (sVar3 <= ix) break;
    lr = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,ix);
    if (lr != (live_range_t_conflict)0x0) {
      fprintf((FILE *)gen_ctx->debug_file,"%lu",ix);
      if (gen_ctx->lr_ctx->scan_vars_num != 0) {
        pFVar1 = (FILE *)gen_ctx->debug_file;
        iVar2 = var_to_scan_var(gen_ctx,(MIR_reg_t)ix);
        fprintf(pFVar1," (%lu)",(long)iVar2);
      }
      if (0x21 < ix) {
        pFVar1 = (FILE *)gen_ctx->debug_file;
        reg = (MIR_reg_t)ix - 0x21;
        tp = MIR_reg_type(ctx,reg,(gen_ctx->curr_func_item->u).func);
        pcVar4 = MIR_type_str(ctx,tp);
        pcVar5 = MIR_reg_name(ctx,reg,(gen_ctx->curr_func_item->u).func);
        fprintf(pFVar1," (%s:%s)",pcVar4,pcVar5);
      }
      fputc(0x3a,(FILE *)gen_ctx->debug_file);
      print_live_ranges(gen_ctx,lr);
    }
    ix = ix + 1;
  }
  return;
}

Assistant:

static void print_all_live_ranges (gen_ctx_t gen_ctx) {
  MIR_context_t ctx = gen_ctx->ctx;
  live_range_t lr;

  fprintf (debug_file, "+++++++++++++Live ranges:\n");
  for (size_t i = 0; i < VARR_LENGTH (live_range_t, var_live_ranges); i++) {
    if ((lr = VARR_GET (live_range_t, var_live_ranges, i)) == NULL) continue;
    fprintf (debug_file, "%lu", (unsigned long) i);
    if (scan_vars_num != 0)
      fprintf (debug_file, " (%lu)", (unsigned long) var_to_scan_var (gen_ctx, (MIR_reg_t) i));
    if (i > MAX_HARD_REG)
      fprintf (debug_file, " (%s:%s)",
               MIR_type_str (ctx, MIR_reg_type (ctx, (MIR_reg_t) (i - MAX_HARD_REG),
                                                curr_func_item->u.func)),
               MIR_reg_name (ctx, (MIR_reg_t) (i - MAX_HARD_REG), curr_func_item->u.func));
    fprintf (debug_file, ":");
    print_live_ranges (gen_ctx, lr);
  }
}